

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFilterContains.cpp
# Opt level: O0

bool __thiscall
liblogger::LogFilterContains::Filter(LogFilterContains *this,LogType Type,string *str)

{
  int iVar1;
  char *__s1;
  char *__s2;
  long lVar2;
  string *in_RDX;
  long in_RDI;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    __s1 = (char *)std::__cxx11::string::c_str();
    __s2 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcasecmp(__s1,__s2);
    if (iVar1 == 0) {
      return true;
    }
  }
  else {
    lVar2 = std::__cxx11::string::find(in_RDX,in_RDI + 8);
    if (lVar2 != -1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool LogFilterContains::Filter(const LogType Type, const std::string &str)
{
	if (m_case == false)
	{
		if (strcasecmp(m_match.c_str(), str.c_str()) == 0)
		{
			return true;
		}
	}
	else
	{
		if (str.find(m_match) != std::string::npos)
		{
			return true;
		}
	}

	return false;
}